

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fountain.c
# Opt level: O3

void dofindgem(void)

{
  undefined1 *puVar1;
  int otyp;
  char *line;
  
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a155e;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a1559;
LAB_001a158b:
    line = "You spot a gem in the sparkling waters!";
  }
  else {
LAB_001a1559:
    if (ublindf != (obj *)0x0) {
LAB_001a155e:
      if (ublindf->oartifact == '\x1d') goto LAB_001a158b;
    }
    line = "You feel a gem here!";
  }
  pline(line);
  otyp = rnd_class(0x1f0,0x20e);
  mksobj_at(otyp,level,(int)u.ux,(int)u.uy,'\0','\0');
  puVar1 = &level->locations[u.ux][u.uy].field_0x6;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x10;
  newsym((int)u.ux,(int)u.uy);
  exercise(2,'\x01');
  return;
}

Assistant:

static void dofindgem(void) /* Find a gem in the sparkling waters. */
{
	if (!Blind) pline("You spot a gem in the sparkling waters!");
	else pline("You feel a gem here!");
	mksobj_at(rnd_class(DILITHIUM_CRYSTAL, LUCKSTONE-1), level,
			 u.ux, u.uy, FALSE, FALSE);
	SET_FOUNTAIN_LOOTED(u.ux,u.uy);
	newsym(u.ux, u.uy);
	exercise(A_WIS, TRUE);			/* a discovery! */
}